

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O0

void discard_entry(quicly_sentmap_t *map,quicly_sentmap_iter_t *iter)

{
  long lVar1;
  st_quicly_sent_block_t *psVar2;
  st_quicly_sent_block_t **ppsVar3;
  quicly_sentmap_t *in_RSI;
  st_quicly_sent_block_t *block;
  
  if (in_RSI->head->next != (st_quicly_sent_block_t *)0x0) {
    in_RSI->head->next = (st_quicly_sent_block_t *)0x0;
    ppsVar3 = *(st_quicly_sent_block_t ***)in_RSI->num_packets;
    psVar2 = (st_quicly_sent_block_t *)((long)&ppsVar3[1][-1].entries[0xf].data + 0x17);
    ppsVar3[1] = psVar2;
    if (psVar2 == (st_quicly_sent_block_t *)0x0) {
      ppsVar3 = free_block(in_RSI,ppsVar3);
      in_RSI->num_packets = (size_t)ppsVar3;
      lVar1 = *(long *)in_RSI->num_packets;
      in_RSI->head = (st_quicly_sent_block_t *)(lVar1 + -8);
      in_RSI->tail = (st_quicly_sent_block_t *)(*(long *)(lVar1 + 8) + 1);
    }
    return;
  }
  __assert_fail("iter->p->acked != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sentmap.c"
                ,0x49,"void discard_entry(quicly_sentmap_t *, quicly_sentmap_iter_t *)");
}

Assistant:

static void discard_entry(quicly_sentmap_t *map, quicly_sentmap_iter_t *iter)
{
    assert(iter->p->acked != NULL);
    iter->p->acked = NULL;

    struct st_quicly_sent_block_t *block = *iter->ref;
    if (--block->num_entries == 0) {
        iter->ref = free_block(map, iter->ref);
        block = *iter->ref;
        iter->p = block->entries - 1;
        iter->count = block->num_entries + 1;
    }
}